

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O3

REF_STATUS
ref_mpi_allconcat(REF_MPI ref_mpi,REF_INT ldim,REF_INT my_size,void *my_array,REF_INT *total_size,
                 REF_INT **source,void **concatenated,REF_TYPE type)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  REF_INT *counts;
  REF_INT *pRVar4;
  void *concatenated_array;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  REF_MPI ref_mpi_00;
  char *pcVar9;
  
  if ((long)ref_mpi->n < 0) {
    pcVar9 = "malloc counts of REF_INT negative";
    uVar7 = 0x3da;
    goto LAB_0012b81b;
  }
  counts = (REF_INT *)malloc((long)ref_mpi->n << 2);
  if (counts == (REF_INT *)0x0) {
    pcVar9 = "malloc counts of REF_INT NULL";
    uVar7 = 0x3da;
LAB_0012b86d:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar7,
           "ref_mpi_allconcat",pcVar9);
    return 2;
  }
  *counts = my_size;
  *total_size = 0;
  uVar3 = ref_mpi->n;
  uVar2 = 0;
  if (0 < (int)uVar3) {
    lVar6 = 0;
    do {
      uVar2 = uVar2 + counts[lVar6];
      *total_size = uVar2;
      lVar6 = lVar6 + 1;
      uVar3 = ref_mpi->n;
    } while (lVar6 < (int)uVar3);
    if ((int)uVar2 < 0) {
      pcVar9 = "malloc *source of REF_INT negative";
      uVar7 = 0x3e1;
      goto LAB_0012b81b;
    }
  }
  pRVar4 = (REF_INT *)malloc((ulong)uVar2 * 4);
  *source = pRVar4;
  if (pRVar4 == (REF_INT *)0x0) {
    pcVar9 = "malloc *source of REF_INT NULL";
    uVar7 = 0x3e1;
    goto LAB_0012b86d;
  }
  if ((int)uVar3 < 1) {
    uVar5 = 0;
  }
  else {
    uVar8 = 0;
    uVar5 = 0;
    do {
      iVar1 = counts[uVar8];
      if (0 < iVar1) {
        lVar6 = 0;
        do {
          pRVar4[(int)uVar5 + lVar6] = (REF_INT)uVar8;
          lVar6 = lVar6 + 1;
        } while (iVar1 != (int)lVar6);
        uVar5 = uVar5 + (int)lVar6;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar3);
  }
  if (uVar2 != uVar5) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",1000,
           "ref_mpi_allconcat","count mismatch",(ulong)uVar2,(long)(int)uVar5);
    return 1;
  }
  if (type == 3) {
    if ((int)(uVar2 * ldim) < 0) {
      pcVar9 = "malloc *((REF_DBL **)concatenated) of REF_DBL negative";
      uVar7 = 0x3ef;
LAB_0012b81b:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar7,
             "ref_mpi_allconcat",pcVar9);
      return 1;
    }
    ref_mpi_00 = (REF_MPI)((ulong)(uVar2 * ldim) << 3);
    concatenated_array = malloc((size_t)ref_mpi_00);
    *concatenated = concatenated_array;
    if (concatenated_array == (void *)0x0) {
      pcVar9 = "malloc *((REF_DBL **)concatenated) of REF_DBL NULL";
      uVar7 = 0x3ef;
      goto LAB_0012b86d;
    }
  }
  else {
    if (type != 1) {
      pcVar9 = "data type";
      uVar3 = 6;
      uVar7 = 0x3f2;
      uVar8 = 6;
      goto LAB_0012ba08;
    }
    if ((int)(uVar2 * ldim) < 0) {
      pcVar9 = "malloc *((REF_INT **)concatenated) of REF_INT negative";
      uVar7 = 0x3ec;
      goto LAB_0012b81b;
    }
    ref_mpi_00 = (REF_MPI)((ulong)(uVar2 * ldim) << 2);
    concatenated_array = malloc((size_t)ref_mpi_00);
    *concatenated = concatenated_array;
    if (concatenated_array == (void *)0x0) {
      pcVar9 = "malloc *((REF_INT **)concatenated) of REF_INT NULL";
      uVar7 = 0x3ec;
      goto LAB_0012b86d;
    }
  }
  if (0 < (int)uVar3) {
    uVar8 = 0;
    do {
      counts[uVar8] = counts[uVar8] * ldim;
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  uVar3 = ref_mpi_allgatherv(ref_mpi_00,my_array,counts,concatenated_array,type);
  if (uVar3 == 0) {
    free(counts);
    return 0;
  }
  pcVar9 = "gather values";
  uVar7 = 0x3f9;
  uVar8 = (ulong)uVar3;
LAB_0012ba08:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar7,
         "ref_mpi_allconcat",uVar8,pcVar9);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_allconcat(REF_MPI ref_mpi, REF_INT ldim,
                                     REF_INT my_size, void *my_array,
                                     REF_INT *total_size, REF_INT **source,
                                     void **concatenated, REF_TYPE type) {
  REF_INT proc, i, tot;
  REF_INT *counts;

  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, (void *)(&my_size), (void *)counts,
                        REF_INT_TYPE),
      "gather size");

  *total_size = 0;
  each_ref_mpi_part(ref_mpi, proc)(*total_size) += counts[proc];
  ref_malloc(*source, *total_size, REF_INT);

  tot = 0;
  each_ref_mpi_part(ref_mpi, proc) for (i = 0; i < counts[proc]; i++) {
    (*source)[tot] = proc;
    tot++;
  }
  REIS(*total_size, tot, "count mismatch");

  switch (type) {
    case REF_INT_TYPE:
      ref_malloc(*((REF_INT **)concatenated), ldim * (*total_size), REF_INT);
      break;
    case REF_DBL_TYPE:
      ref_malloc(*((REF_DBL **)concatenated), ldim * (*total_size), REF_DBL);
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }

  /* pad ldim */
  each_ref_mpi_part(ref_mpi, proc) counts[proc] *= ldim;

  RSS(ref_mpi_allgatherv(ref_mpi, my_array, counts, *concatenated, type),
      "gather values");

  ref_free(counts);

  return REF_SUCCESS;
}